

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderFunctions.cpp
# Opt level: O2

void __thiscall wasm::CallCountScanner::~CallCountScanner(CallCountScanner *this)

{
  WalkerPass<wasm::PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>_>
  ::~WalkerPass(&this->
                 super_WalkerPass<wasm::PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>_>
               );
  operator_delete(this,0x110);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }